

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_assert.cpp
# Opt level: O3

void crnlib_assert(char *pExp,char *pFile,uint line)

{
  bool bVar1;
  char buf [512];
  char acStack_208 [512];
  
  snprintf(acStack_208,0x200,"%s(%u): Assertion failed: \"%s\"\n",pFile,(ulong)line,pExp);
  crnlib_output_debug_string(acStack_208);
  fputs(acStack_208,_stderr);
  bVar1 = crnlib_is_debugger_present();
  if (bVar1) {
    crnlib_debug_break();
  }
  return;
}

Assistant:

void crnlib_assert(const char* pExp, const char* pFile, unsigned line) {
  char buf[512];

  crnlib_snprintf(buf, sizeof(buf), "%s(%u): Assertion failed: \"%s\"\n", pFile, line, pExp);

  crnlib_output_debug_string(buf);

  fputs(buf, stderr);

  if (crnlib_is_debugger_present())
    crnlib_debug_break();
}